

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O1

OperatorResultType __thiscall
duckdb::PhysicalNestedLoopJoin::ResolveComplexJoin
          (PhysicalNestedLoopJoin *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk,
          OperatorState *state_p)

{
  OperatorState *lpos;
  DataChunk *result;
  DataChunk *result_00;
  _func_int **pp_Var1;
  long lVar2;
  ColumnDataScanState *state;
  ColumnDataScanState *state_00;
  ColumnDataCollection *this_00;
  DataChunk *result_01;
  bool bVar3;
  idx_t count_p;
  InternalException *pIVar4;
  idx_t iVar5;
  OperatorState *pOVar6;
  idx_t iVar7;
  __pthread_list_t *this_01;
  SelectionVector lvector;
  SelectionVector rvector;
  string local_b0;
  pointer local_90;
  ColumnDataScanState *local_88;
  ColumnDataScanState *local_80;
  ColumnDataCollection *local_78;
  DataChunk *local_70;
  ExpressionExecutor *local_68;
  OperatorState *local_60;
  OperatorState *local_58;
  vector<duckdb::JoinCondition,_true> *local_50;
  SelectionVector local_48;
  
  local_90 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                           super_CachingPhysicalOperator.super_PhysicalOperator.sink_state);
  lpos = state_p + 0x44;
  local_78 = (ColumnDataCollection *)
             &local_90[2].super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
              super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_80 = (ColumnDataScanState *)(state_p + 0x14);
  result = (DataChunk *)(state_p + 0x34);
  this_01 = &local_90[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
             __list;
  local_88 = (ColumnDataScanState *)(state_p + 0x24);
  result_00 = (DataChunk *)(state_p + 0x3c);
  local_70 = (DataChunk *)(state_p + 3);
  local_68 = (ExpressionExecutor *)(state_p + 0xb);
  local_58 = state_p + 0x45;
  local_50 = &(this->super_PhysicalComparisonJoin).conditions;
  pOVar6 = state_p;
  local_60 = state_p;
  do {
    if (*(char *)((long)&pOVar6[2]._vptr_OperatorState + 3) == '\x01') {
      *(undefined1 *)((long)&pOVar6[2]._vptr_OperatorState + 3) = 0;
      lpos->_vptr_OperatorState = (_func_int **)0x0;
      state_p[0x45]._vptr_OperatorState = (_func_int **)0x0;
      bVar3 = ColumnDataCollection::Scan(local_78,local_80,result);
      if (!bVar3) {
        *(undefined1 *)((long)&pOVar6[2]._vptr_OperatorState + 2) = 1;
        if ((*(char *)&pOVar6[0x46]._vptr_OperatorState == '\x01') &&
           (OuterJoinMarker::ConstructLeftJoinResult((OuterJoinMarker *)(pOVar6 + 0x46),input,chunk)
           , ((OuterJoinMarker *)(pOVar6 + 0x46))->enabled == true)) {
          switchD_01306cb1::default
                    (pOVar6[0x47]._vptr_OperatorState,0,(size_t)pOVar6[0x48]._vptr_OperatorState);
          return NEED_MORE_INPUT;
        }
        return NEED_MORE_INPUT;
      }
      bVar3 = ColumnDataCollection::Scan((ColumnDataCollection *)this_01,local_88,result_00);
      if (!bVar3) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Nested loop join: payload and conditions are unaligned!?",""
                  );
        InternalException::InternalException(pIVar4,&local_b0);
        __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (pOVar6[0x37]._vptr_OperatorState != pOVar6[0x3f]._vptr_OperatorState) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Nested loop join: payload and conditions are unaligned!?",""
                  );
        InternalException::InternalException(pIVar4,&local_b0);
        __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    result_01 = local_70;
    if (*(char *)((long)&pOVar6[2]._vptr_OperatorState + 2) == '\x01') {
      DataChunk::Reset(local_70);
      ExpressionExecutor::Execute(local_68,input,result_01);
      this_00 = local_78;
      state_00 = local_80;
      lpos->_vptr_OperatorState = (_func_int **)0x0;
      state_p[0x45]._vptr_OperatorState = (_func_int **)0x0;
      ColumnDataCollection::InitializeScan(local_78,local_80,ALLOW_ZERO_COPY);
      pOVar6 = local_60;
      state = local_88;
      ColumnDataCollection::Scan(this_00,state_00,result);
      ColumnDataCollection::InitializeScan((ColumnDataCollection *)this_01,state,ALLOW_ZERO_COPY);
      ColumnDataCollection::Scan((ColumnDataCollection *)this_01,state,result_00);
      *(undefined1 *)((long)&pOVar6[2]._vptr_OperatorState + 2) = 0;
    }
    DataChunk::Verify(input);
    DataChunk::Verify(result);
    DataChunk::Verify(result_00);
    SelectionVector::SelectionVector((SelectionVector *)&local_b0,0x800);
    SelectionVector::SelectionVector(&local_48,0x800);
    count_p = NestedLoopJoinInner::Perform
                        ((idx_t *)lpos,(idx_t *)local_58,local_70,result,
                         (SelectionVector *)&local_b0,&local_48,local_50);
    if (count_p != 0) {
      if (*(char *)&pOVar6[0x46]._vptr_OperatorState == '\x01') {
        pp_Var1 = pOVar6[0x47]._vptr_OperatorState;
        iVar5 = 0;
        do {
          iVar7 = iVar5;
          if (local_b0._M_dataplus._M_p != (pointer)0x0) {
            iVar7 = (idx_t)*(uint *)(local_b0._M_dataplus._M_p + iVar5 * 4);
          }
          *(undefined1 *)((long)pp_Var1 + iVar7) = 1;
          iVar5 = iVar5 + 1;
        } while (count_p != iVar5);
      }
      if (local_90[4].super_StateWithBlockableTasks.can_block._M_base._M_i == true) {
        lVar2 = local_90[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align;
        pp_Var1 = pOVar6[0x1e]._vptr_OperatorState;
        iVar5 = 0;
        do {
          iVar7 = iVar5;
          if (local_48.sel_vector != (sel_t *)0x0) {
            iVar7 = (idx_t)local_48.sel_vector[iVar5];
          }
          *(undefined1 *)((long)pp_Var1 + iVar7 + lVar2) = 1;
          iVar5 = iVar5 + 1;
        } while (count_p != iVar5);
      }
      DataChunk::Slice(chunk,input,(SelectionVector *)&local_b0,count_p,0);
      DataChunk::Slice(chunk,result_00,&local_48,count_p,
                       ((long)(input->data).
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(input->data).
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
    }
    if (pOVar6[0x37]._vptr_OperatorState <= pOVar6[0x45]._vptr_OperatorState) {
      *(undefined1 *)((long)&pOVar6[2]._vptr_OperatorState + 3) = 1;
    }
    if (local_48.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.field_2._M_allocated_capacity !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_b0.field_2._M_allocated_capacity);
    }
    if (count_p != 0) {
      return HAVE_MORE_OUTPUT;
    }
  } while( true );
}

Assistant:

OperatorResultType PhysicalNestedLoopJoin::ResolveComplexJoin(ExecutionContext &context, DataChunk &input,
                                                              DataChunk &chunk, OperatorState &state_p) const {
	auto &state = state_p.Cast<PhysicalNestedLoopJoinState>();
	auto &gstate = sink_state->Cast<NestedLoopJoinGlobalState>();

	idx_t match_count;
	do {
		if (state.fetch_next_right) {
			// we exhausted the chunk on the right: move to the next chunk on the right
			state.left_tuple = 0;
			state.right_tuple = 0;
			state.fetch_next_right = false;
			// check if we exhausted all chunks on the RHS
			if (gstate.right_condition_data.Scan(state.condition_scan_state, state.right_condition)) {
				if (!gstate.right_payload_data.Scan(state.payload_scan_state, state.right_payload)) {
					throw InternalException("Nested loop join: payload and conditions are unaligned!?");
				}
				if (state.right_condition.size() != state.right_payload.size()) {
					throw InternalException("Nested loop join: payload and conditions are unaligned!?");
				}
			} else {
				// we exhausted all chunks on the right: move to the next chunk on the left
				state.fetch_next_left = true;
				if (state.left_outer.Enabled()) {
					// left join: before we move to the next chunk, see if we need to output any vectors that didn't
					// have a match found
					state.left_outer.ConstructLeftJoinResult(input, chunk);
					state.left_outer.Reset();
				}
				return OperatorResultType::NEED_MORE_INPUT;
			}
		}
		if (state.fetch_next_left) {
			// resolve the left join condition for the current chunk
			state.left_condition.Reset();
			state.lhs_executor.Execute(input, state.left_condition);

			state.left_tuple = 0;
			state.right_tuple = 0;
			gstate.right_condition_data.InitializeScan(state.condition_scan_state);
			gstate.right_condition_data.Scan(state.condition_scan_state, state.right_condition);

			gstate.right_payload_data.InitializeScan(state.payload_scan_state);
			gstate.right_payload_data.Scan(state.payload_scan_state, state.right_payload);
			state.fetch_next_left = false;
		}
		// now we have a left and a right chunk that we can join together
		// note that we only get here in the case of a LEFT, INNER or FULL join
		auto &left_chunk = input;
		auto &right_condition = state.right_condition;
		auto &right_payload = state.right_payload;

		// sanity check
		left_chunk.Verify();
		right_condition.Verify();
		right_payload.Verify();

		// now perform the join
		SelectionVector lvector(STANDARD_VECTOR_SIZE), rvector(STANDARD_VECTOR_SIZE);
		match_count = NestedLoopJoinInner::Perform(state.left_tuple, state.right_tuple, state.left_condition,
		                                           right_condition, lvector, rvector, conditions);
		// we have finished resolving the join conditions
		if (match_count > 0) {
			// we have matching tuples!
			// construct the result
			state.left_outer.SetMatches(lvector, match_count);
			gstate.right_outer.SetMatches(rvector, match_count, state.condition_scan_state.current_row_index);

			chunk.Slice(input, lvector, match_count);
			chunk.Slice(right_payload, rvector, match_count, input.ColumnCount());
		}

		// check if we exhausted the RHS, if we did we need to move to the next right chunk in the next iteration
		if (state.right_tuple >= right_condition.size()) {
			state.fetch_next_right = true;
		}
	} while (match_count == 0);
	return OperatorResultType::HAVE_MORE_OUTPUT;
}